

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

void ma_device_source_name_callback
               (ma_pa_context *pPulseContext,ma_pa_source_info *pInfo,int endOfList,void *pUserData)

{
  char cVar1;
  char *pcVar2;
  long lVar3;
  undefined1 *puVar4;
  
  if (endOfList < 1) {
    if (pUserData == (void *)0x0) {
      __assert_fail("pDevice != __null",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                    ,0x4be6,
                    "void ma_device_source_name_callback(ma_pa_context *, const ma_pa_source_info *, int, void *)"
                   );
    }
    puVar4 = (undefined1 *)((long)pUserData + 0x2a98);
    pcVar2 = pInfo->description;
    if (pcVar2 != (char *)0x0) {
      lVar3 = 0;
      do {
        cVar1 = pcVar2[lVar3];
        if (cVar1 == '\0') goto LAB_0010e694;
        puVar4[lVar3] = cVar1;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0xff);
      lVar3 = 0xff;
LAB_0010e694:
      puVar4 = puVar4 + lVar3;
    }
    *puVar4 = 0;
  }
  return;
}

Assistant:

static void ma_device_source_name_callback(ma_pa_context* pPulseContext, const ma_pa_source_info* pInfo, int endOfList, void* pUserData)
{
    ma_device* pDevice;

    if (endOfList > 0) {
        return;
    }

    pDevice = (ma_device*)pUserData;
    MA_ASSERT(pDevice != NULL);

    ma_strncpy_s(pDevice->capture.name, sizeof(pDevice->capture.name), pInfo->description, (size_t)-1);

    (void)pPulseContext; /* Unused. */
}